

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

bool __thiscall
GrcManager::AddAllGlyphsToTheAnyClass
          (GrcManager *this,GrcFont *pfont,
          map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
          *hmActualForPseudo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GrcSymbolTable *this_00;
  size_t sVar2;
  Symbol this_01;
  GdlGlyphClassDefn *this_02;
  GdlGlyphClassMember *pglfd;
  GrpLineAndFile lnf;
  string local_78;
  GrpLineAndFile local_58;
  
  this_00 = this->m_psymtbl;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ANY","");
  this_01 = GrcSymbolTable::FindSymbol(this_00,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  this_02 = GrcSymbolTableEntry::GlyphClassDefnData(this_01);
  pglfd = (GdlGlyphClassMember *)operator_new(0xb0);
  sVar2 = this->m_cwGlyphIDs;
  GdlObject::GdlObject(&(pglfd->super_GdlDefn).super_GdlObject);
  pglfd->m_fIsSpaceGlyph = -1;
  (pglfd->super_GdlDefn)._vptr_GdlDefn = (_func_int **)&PTR__GdlGlyphDefn_00241c30;
  *(undefined8 *)&pglfd->field_0x34 = 2;
  *(int *)((long)&pglfd[1].super_GdlDefn._vptr_GdlDefn + 4) = (int)sVar2 + -1;
  *(undefined2 *)&pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = 0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p = (pointer)0x0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_string_length =
       (size_type)((long)&pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 8);
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity = 0;
  pglfd[1].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_local_buf[8] = '\0';
  pglfd[2].super_GdlDefn._vptr_GdlDefn = (_func_int **)0x0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_nLinePre = 0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_nLineOrig = 0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile._M_dataplus._M_p = (pointer)0x0;
  pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 8) = 0;
  *(undefined8 *)((long)&pglfd[2].super_GdlDefn.super_GdlObject.m_lnf.m_staFile.field_2 + 10) = 0;
  *(undefined8 *)((long)&pglfd[2].m_fIsSpaceGlyph + 2) = 0;
  paVar1 = &local_58.m_staFile.field_2;
  local_58.m_nLinePre = -1;
  local_58.m_nLineOrig = -1;
  local_58.m_staFile._M_string_length = 0;
  local_58.m_staFile.field_2._M_local_buf[0] = '\0';
  local_58.m_staFile._M_dataplus._M_p = (pointer)paVar1;
  GdlGlyphClassDefn::AddMember(this_02,pglfd,&local_58);
  (*(this_02->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn[0x1b])
            (this_02,pfont,(ulong)(ushort)this->m_cwGlyphIDs,hmActualForPseudo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_staFile._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.m_staFile._M_dataplus._M_p,
                    CONCAT71(local_58.m_staFile.field_2._M_allocated_capacity._1_7_,
                             local_58.m_staFile.field_2._M_local_buf[0]) + 1);
  }
  return true;
}

Assistant:

bool GrcManager::AddAllGlyphsToTheAnyClass(GrcFont * pfont,
	std::map<utf16, utf16> & hmActualForPseudo)
{
	Symbol psym = m_psymtbl->FindSymbol("ANY");
	GdlGlyphClassDefn * pglfcAny = psym->GlyphClassDefnData();
	Assert(pglfcAny);

	GdlGlyphDefn * pglf = new GdlGlyphDefn(kglftGlyphID, 0, int(m_cwGlyphIDs - 1));
	GrpLineAndFile lnf;	// bogus
	pglfcAny->AddMember(pglf, lnf);

	pglfcAny->AssignGlyphIDs(pfont, gr::gid16(m_cwGlyphIDs), hmActualForPseudo);

	return true;
}